

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str-util.cc
# Opt level: O0

bool tinyusdz::makeUniqueName
               (multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *nameSet,string *name,string *unique_name)

{
  size_type sVar1;
  __cxx11 local_88 [36];
  undefined4 local_64;
  size_type local_60;
  size_t i;
  size_t cnt;
  string new_name;
  size_t kMaxLoop;
  string *unique_name_local;
  string *name_local;
  multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *nameSet_local;
  
  if (unique_name == (string *)0x0) {
    nameSet_local._7_1_ = false;
  }
  else {
    sVar1 = ::std::
            multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(nameSet,name);
    if (sVar1 == 0) {
      ::std::__cxx11::string::operator=((string *)unique_name,(string *)name);
      nameSet_local._7_1_ = false;
    }
    else {
      new_name.field_2._8_8_ = 0x400;
      ::std::__cxx11::string::string((string *)&cnt,(string *)name);
      for (i = 0; i < 0x400; i = i + 1) {
        local_60 = ::std::
                   multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::count(nameSet,(key_type *)&cnt);
        if (local_60 == 0) {
          nameSet_local._7_1_ = false;
          goto LAB_003a310c;
        }
        std::__cxx11::to_string(local_88,local_60);
        ::std::__cxx11::string::operator+=((string *)&cnt,(string *)local_88);
        ::std::__cxx11::string::~string((string *)local_88);
        sVar1 = ::std::
                multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count(nameSet,(key_type *)&cnt);
        if (sVar1 == 0) {
          ::std::__cxx11::string::operator=((string *)unique_name,(string *)&cnt);
          nameSet_local._7_1_ = true;
          goto LAB_003a310c;
        }
      }
      nameSet_local._7_1_ = false;
LAB_003a310c:
      local_64 = 1;
      ::std::__cxx11::string::~string((string *)&cnt);
    }
  }
  return nameSet_local._7_1_;
}

Assistant:

bool makeUniqueName(std::multiset<std::string> &nameSet,
                    const std::string &name, std::string *unique_name) {
  if (!unique_name) {
    return false;
  }

  if (nameSet.count(name) == 0) {
    (*unique_name) = name;
    return 0;
  }

  // Simply add number

  const size_t kMaxLoop = 1024;  // to avoid infinite loop.

  std::string new_name = name;

  size_t cnt = 0;
  while (cnt < kMaxLoop) {
    size_t i = nameSet.count(new_name);
    if (i == 0) {
      // This should not happen though.
      return false;
    }

    new_name += std::to_string(i);

    if (nameSet.count(new_name) == 0) {
      (*unique_name) = new_name;
      return true;
    }

    cnt++;
  }

  return false;
}